

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O3

bool __thiscall
PS2KeyboardAnalyzerSettings::SetSettingsFromInterfaces(PS2KeyboardAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  byte bVar1;
  long lVar2;
  double dVar3;
  Channel aCStack_48 [16];
  Channel local_38 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  this_00 = &this->mClockChannel;
  Channel::operator=(this_00,aCStack_48);
  Channel::~Channel(aCStack_48);
  AnalyzerSettingInterfaceChannel::GetChannel();
  this_01 = &this->mDataChannel;
  Channel::operator=(this_01,aCStack_48);
  Channel::~Channel(aCStack_48);
  dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mDeviceType = dVar3;
  AnalyzerSettings::ClearChannels();
  Channel::Channel(aCStack_48);
  Channel::Channel(local_38);
  Channel::operator=(aCStack_48,this_00);
  Channel::operator=(local_38,this_01);
  bVar1 = AnalyzerHelpers::DoChannelsOverlap(aCStack_48,2);
  if (bVar1 == 0) {
    AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
  }
  lVar2 = 0x10;
  do {
    Channel::~Channel(aCStack_48 + lVar2);
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -0x10);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool PS2KeyboardAnalyzerSettings::SetSettingsFromInterfaces()
{
    mClockChannel = mClockChannelInterface->GetChannel();
    mDataChannel = mDataChannelInterface->GetChannel();
    mDeviceType = mDeviceTypeInterface->GetNumber();
    ClearChannels();

    Channel ArrayOfChannels[ 2 ];
    ArrayOfChannels[ 0 ] = mClockChannel;
    ArrayOfChannels[ 1 ] = mDataChannel;

    bool IsInvalidConfig = AnalyzerHelpers::DoChannelsOverlap( ArrayOfChannels, 2 );

    if( IsInvalidConfig )
    {
        SetErrorText( "Clock and Data must be unique channels!" );
        return false;
    }
    else
    {
        AddChannel( mClockChannel, "PS/2 - Clock", true );
        AddChannel( mDataChannel, "PS/2 - Data", true );
        return true;
    }

    return true;
}